

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O2

ON_Locale * ON_Locale::FromWindowsLCID(ON_Locale *__return_storage_ptr__,ON__UINT32 windows_lcid)

{
  char *name;
  ON__UINT32 windows_lcid_00;
  
  switch(windows_lcid) {
  case 0x404:
    name = "zh-TW";
    windows_lcid_00 = 0x404;
    break;
  case 0x405:
    name = "cs-CZ";
    windows_lcid_00 = 0x405;
    break;
  case 0x406:
  case 0x408:
  case 0x40b:
  case 0x40d:
  case 0x40e:
  case 0x40f:
  case 0x413:
  case 0x414:
switchD_004e7f70_caseD_406:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_locale.cpp"
               ,0x375,"","No case for this windows_lcid in the generic runtime code.");
    memcpy(__return_storage_ptr__,&Ordinal,0xa0);
    return __return_storage_ptr__;
  case 0x407:
    name = "de-DE";
    windows_lcid_00 = 0x407;
    break;
  case 0x409:
    name = "en-US";
    windows_lcid_00 = 0x409;
    break;
  case 0x40a:
    name = "es-ES_tradnl";
    windows_lcid_00 = 0x40a;
    break;
  case 0x40c:
    name = "fr-FR";
    windows_lcid_00 = 0x40c;
    break;
  case 0x410:
    name = "it-IT";
    windows_lcid_00 = 0x410;
    break;
  case 0x411:
    name = "ja-JP";
    windows_lcid_00 = 0x411;
    break;
  case 0x412:
    name = "ko-KR";
    windows_lcid_00 = 0x412;
    break;
  case 0x415:
    name = "pl-PL";
    windows_lcid_00 = 0x415;
    break;
  default:
    if ((windows_lcid < 0x28) && ((0x8000000003U >> ((ulong)windows_lcid & 0x3f) & 1) != 0)) {
      ON_Locale(__return_storage_ptr__);
      __return_storage_ptr__->m_windows_lcid = windows_lcid;
      return __return_storage_ptr__;
    }
    if (windows_lcid == 0x804) {
      name = "zh-CN";
      windows_lcid_00 = 0x804;
    }
    else if (windows_lcid == 0x816) {
      name = "pt-PT";
      windows_lcid_00 = 0x816;
    }
    else {
      if (windows_lcid != 0xc0a) goto switchD_004e7f70_caseD_406;
      name = "es-ES";
      windows_lcid_00 = 0xc0a;
    }
  }
  FromWindowsLCIDAndName(__return_storage_ptr__,windows_lcid_00,name);
  return __return_storage_ptr__;
}

Assistant:

ON_Locale ON_Locale::FromWindowsLCID(
  ON__UINT32 windows_lcid
  )
{
  if (ON_Locale::OrdinalLCID == windows_lcid
    || 1 == windows_lcid // "Rhino locale"
    || ON_Locale::InvariantCultureLCID == windows_lcid
    )
  {
    // This code is called to initialize ON_Locale::Ordinal and ON_Locale::InvariantCulture.
    ON_Locale locale;
    locale.m_windows_lcid = (ON__UINT32)windows_lcid;
    return locale;
  }
  
#if defined(ON_RUNTIME_WIN)

  wchar_t wide_locale_name[LOCALE_NAME_MAX_LENGTH + 1] = { 0 };
  const int locale_name_capacity = (int)(sizeof(wide_locale_name) / sizeof(wide_locale_name[0]) - 1);
  int local_name_length = ::LCIDToLocaleName(
    windows_lcid,
    wide_locale_name,
    locale_name_capacity,
    LOCALE_ALLOW_NEUTRAL_NAMES
    );

  if (0 == local_name_length)
  {
    ON_ERROR("Windows ::LCIDToLocaleName() failed.");
    return ON_Locale::Ordinal;
  }

  if (local_name_length >= ON_Locale::BUFFER_MAXIMUM_CAPACITY)
  {
    ON_ERROR("Windows locale name is too long.");
    return ON_Locale::Ordinal;
  }

  wide_locale_name[locale_name_capacity] = 0;
  char locale_name[ON_Locale::BUFFER_MAXIMUM_CAPACITY + 1] = { 0 };
  if (false == ASCIIWideToChar(wide_locale_name, local_name_length, locale_name, sizeof(locale_name) / sizeof(locale_name[0])) )
  {
    ON_ERROR("Windows locale name contains invalid wchar_t element.");
    return ON_Locale::Ordinal;
  }
  return ON_Locale::FromWindowsLCIDAndName(windows_lcid,locale_name);

#else
  switch (windows_lcid)
  {
  case ON_Locale::WindowsLCID::cs_CZ_LCID:
    return ON_Locale::FromWindowsLCIDAndName(windows_lcid, "cs-CZ" );
    break;
  case ON_Locale::WindowsLCID::de_DE_LCID:
    return ON_Locale::FromWindowsLCIDAndName(windows_lcid, "de-DE" );
    break;
  case ON_Locale::WindowsLCID::en_US_LCID:
    return ON_Locale::FromWindowsLCIDAndName(windows_lcid, "en-US" );
    break;
  case ON_Locale::WindowsLCID::es_ES_LCID:
    return ON_Locale::FromWindowsLCIDAndName(windows_lcid, "es-ES" );
    break;
  case ON_Locale::WindowsLCID::es_ES_tradnl_LCID:
    return ON_Locale::FromWindowsLCIDAndName(windows_lcid, "es-ES_tradnl" );
    break;
  case ON_Locale::WindowsLCID::fr_FR_LCID:
    return ON_Locale::FromWindowsLCIDAndName(windows_lcid, "fr-FR" );
    break;
  case ON_Locale::WindowsLCID::it_IT_LCID:
    return ON_Locale::FromWindowsLCIDAndName(windows_lcid, "it-IT" );
    break;
  case ON_Locale::WindowsLCID::ja_JP_LCID:
    return ON_Locale::FromWindowsLCIDAndName(windows_lcid, "ja-JP" );
    break;
  case ON_Locale::WindowsLCID::ko_KR_LCID:
    return ON_Locale::FromWindowsLCIDAndName(windows_lcid, "ko-KR" );
    break;
  case ON_Locale::WindowsLCID::pl_PL_LCID:
    return ON_Locale::FromWindowsLCIDAndName(windows_lcid, "pl-PL" );
    break;
  case ON_Locale::WindowsLCID::pt_PT_LCID:
    return ON_Locale::FromWindowsLCIDAndName(windows_lcid, "pt-PT" );
    break;
  case ON_Locale::WindowsLCID::zh_CN_LCID:
    // "Hans" script is implied by BCP 47 and should not be in the language tag
    return ON_Locale::FromWindowsLCIDAndName(windows_lcid, "zh-CN" );
    break;
  case ON_Locale::WindowsLCID::zh_TW_LCID:
    // "Hant" script is implied by BCP 47 and should not be in the language tag
    return ON_Locale::FromWindowsLCIDAndName(windows_lcid, "zh-TW" );
    break;
  }

  ON_ERROR("No case for this windows_lcid in the generic runtime code.");
  return ON_Locale::Ordinal;

#endif
}